

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_generator.cpp
# Opt level: O2

uint32_t __thiscall defyx::Blake2Generator::getUInt32(Blake2Generator *this)

{
  uint32_t uVar1;
  
  checkData(this,4);
  uVar1 = *(uint32_t *)(this->data + this->dataIndex);
  this->dataIndex = this->dataIndex + 4;
  return uVar1;
}

Assistant:

uint32_t Blake2Generator::getUInt32() {
		checkData(4);
		auto ret = load32(&data[dataIndex]);
		dataIndex += 4;
		return ret;
	}